

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall cmake::SetHomeOutputDirectory(cmake *this,string *dir)

{
  bool bVar1;
  string local_40;
  
  cmState::SetBinaryDirectory(this->State,dir);
  bVar1 = cmState::Snapshot::IsValid(&this->CurrentSnapshot);
  if (bVar1) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CMAKE_BINARY_DIR","");
    cmState::Snapshot::SetDefinition(&this->CurrentSnapshot,&local_40,dir);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmake::SetHomeOutputDirectory(const std::string& dir)
{
  this->State->SetBinaryDirectory(dir);
  if (this->CurrentSnapshot.IsValid())
    {
    this->CurrentSnapshot.SetDefinition("CMAKE_BINARY_DIR", dir);
    }
}